

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_InsertEraseStressTest_Test::TestBody
          (Table_InsertEraseStressTest_Test *this)

{
  unsigned_long uVar1;
  bool bVar2;
  size_t sVar3;
  reference pvVar4;
  char *message;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
  local_128;
  uint local_10c;
  AssertHelper local_108;
  Message local_100;
  value_type local_f8;
  size_type local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  size_t kNumIterations;
  unsigned_long local_b0;
  size_t i;
  undefined1 local_98 [8];
  deque<unsigned_long,_std::allocator<unsigned_long>_> keys;
  size_t kMinElementCount;
  IntTable t;
  Table_InsertEraseStressTest_Test *this_local;
  
  t.
  super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
        )(_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          )this;
  IntTable::IntTable((IntTable *)&kMinElementCount);
  keys.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0xfa;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_98);
  for (local_b0 = 0; uVar1 = local_b0, sVar3 = MaxDensitySize(0xfa), uVar1 < sVar3;
      local_b0 = local_b0 + 1) {
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::emplace<unsigned_long_&,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
                *)&kNumIterations,
               (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                *)&kMinElementCount,&local_b0);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_98,&local_b0);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xf4240;
  for (; local_b0 < 1000000; local_b0 = local_b0 + 1) {
    local_e4 = 1;
    pvVar4 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                       ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_98);
    local_f8 = *pvVar4;
    local_f0 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               ::erase<long>((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                              *)&kMinElementCount,(key_arg<long> *)&local_f8);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_e0,"1","t.erase(keys.front())",&local_e4,&local_f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar2) {
      testing::Message::Message(&local_100);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x30c,message);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message(&local_100);
    }
    local_10c = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    if (local_10c != 0) goto LAB_001425f9;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_98);
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::emplace<unsigned_long_&,_0>
              (&local_128,
               (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                *)&kMinElementCount,&local_b0);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_98,&local_b0);
  }
  local_10c = 0;
LAB_001425f9:
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::~deque
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_98);
  IntTable::~IntTable((IntTable *)&kMinElementCount);
  return;
}

Assistant:

TEST(Table, InsertEraseStressTest) {
  IntTable t;
  const size_t kMinElementCount = 250;
  std::deque<size_t> keys;
  size_t i = 0;
  for (; i < MaxDensitySize(kMinElementCount); ++i) {
    t.emplace(i);
    keys.push_back(i);
  }
  const size_t kNumIterations = 1000000;
  for (; i < kNumIterations; ++i) {
    ASSERT_EQ(1, t.erase(keys.front()));
    keys.pop_front();
    t.emplace(i);
    keys.push_back(i);
  }
}